

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall GraphTest_SimpleSquare_Test::TestBody(GraphTest_SimpleSquare_Test *this)

{
  ostream *in_RDI;
  graph *unaff_retaddr;
  graph lat;
  graph *in_stack_000003d0;
  graph *this_00;
  pointer in_stack_fffffffffffffff0;
  
  this_00 = (graph *)&stack0xffffffffffffffa8;
  lattice::graph::simple((size_t)in_RDI,(size_t)in_stack_fffffffffffffff0);
  lattice::graph::print(unaff_retaddr,in_RDI);
  check(in_stack_000003d0);
  lattice::graph::~graph(this_00);
  return;
}

Assistant:

TEST(GraphTest, SimpleSquare) {
  graph lat = graph::simple(2, 4);
  lat.print(std::cout);
  check(lat);
}